

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

word * Sfm_NodeReadTruth(Sfm_Ntk_t *p,int i)

{
  int iVar1;
  ulong uVar2;
  Vec_Wrd_t *pVVar3;
  
  if ((i < 0) || ((p->vFanins).nSize <= i)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar2 = (ulong)(uint)i;
  if ((p->vFanins).pArray[uVar2].nSize < 7) {
    pVVar3 = p->vTruths;
    if (i < pVVar3->nSize) {
LAB_0052b473:
      return pVVar3->pArray + uVar2;
    }
  }
  else {
    if (p->vStarts->nSize <= i) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar1 = p->vStarts->pArray[uVar2];
    uVar2 = (ulong)iVar1;
    if ((-1 < (long)uVar2) && (pVVar3 = p->vTruths2, iVar1 < pVVar3->nSize)) goto LAB_0052b473;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

word * Sfm_NodeReadTruth( Sfm_Ntk_t * p, int i )
{
    return Sfm_ObjFaninNum(p, i) <= 6 ? Vec_WrdEntryP( p->vTruths, i ) : Vec_WrdEntryP( p->vTruths2, Vec_IntEntry(p->vStarts, i) );
}